

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O3

void __thiscall
icu_63::RBBISetBuilder::addValToSet(RBBISetBuilder *this,RBBINode *usetNode,uint32_t val)

{
  RBBINode *pRVar1;
  RBBINode *this_00;
  RBBINode *this_01;
  size_t size;
  
  this_00 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(size_t)usetNode);
  if (this_00 != (RBBINode *)0x0) {
    size = 3;
    RBBINode::RBBINode(this_00,leafChar);
    this_00->fVal = val & 0xffff;
    if (usetNode->fLeftChild == (RBBINode *)0x0) {
      usetNode->fLeftChild = this_00;
      this_00->fParent = usetNode;
      return;
    }
    this_01 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,size);
    if (this_01 != (RBBINode *)0x0) {
      RBBINode::RBBINode(this_01,opOr);
      pRVar1 = usetNode->fLeftChild;
      this_01->fLeftChild = pRVar1;
      this_01->fRightChild = this_00;
      pRVar1->fParent = this_01;
      this_00->fParent = this_01;
      usetNode->fLeftChild = this_01;
      this_01->fParent = usetNode;
      return;
    }
  }
  *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
  return;
}

Assistant:

void  RBBISetBuilder::addValToSet(RBBINode *usetNode, uint32_t val) {
    RBBINode *leafNode = new RBBINode(RBBINode::leafChar);
    if (leafNode == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    leafNode->fVal = (unsigned short)val;
    if (usetNode->fLeftChild == NULL) {
        usetNode->fLeftChild = leafNode;
        leafNode->fParent    = usetNode;
    } else {
        // There are already input symbols present for this set.
        // Set up an OR node, with the previous stuff as the left child
        //   and the new value as the right child.
        RBBINode *orNode = new RBBINode(RBBINode::opOr);
        if (orNode == NULL) {
            *fStatus = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        orNode->fLeftChild  = usetNode->fLeftChild;
        orNode->fRightChild = leafNode;
        orNode->fLeftChild->fParent  = orNode;
        orNode->fRightChild->fParent = orNode;
        usetNode->fLeftChild = orNode;
        orNode->fParent = usetNode;
    }
}